

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

lys_module *
lyp_search_file(ly_ctx *ctx,lys_module *module,char *name,char *revision,int implement,
               unres_schema *unres)

{
  char cVar1;
  lys_module **pplVar2;
  int iVar3;
  uint uVar4;
  ly_set *set;
  size_t sVar5;
  DIR *__dirp;
  size_t sVar6;
  dirent *pdVar7;
  size_t sVar8;
  char *pcVar9;
  lys_module *plVar10;
  LY_ERR *pLVar11;
  int *piVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  long lVar16;
  LYS_INFORMAT LVar17;
  LYS_INFORMAT format;
  long lVar18;
  ulong uVar19;
  char *pcVar20;
  undefined1 local_138 [8];
  stat st;
  long local_98;
  lys_node *local_50;
  char *local_48;
  char *wn;
  char *local_38;
  
  local_48 = (char *)0x0;
  st.__glibc_reserved[2] = (__syscall_slong_t)unres;
  set = ly_set_new();
  if (set == (ly_set *)0x0) {
    pLVar11 = ly_errno_location();
    *pLVar11 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyp_search_file");
    return (lys_module *)0x0;
  }
  sVar5 = strlen(name);
  local_50 = (lys_node *)get_current_dir_name();
  if (local_50 == (lys_node *)0x0) {
LAB_00123148:
    pLVar11 = ly_errno_location();
    *pLVar11 = LY_EMEM;
    local_50 = (lys_node *)0x0;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyp_search_file");
LAB_00123170:
    __dirp = (DIR *)0x0;
  }
  else {
    iVar3 = ly_set_add(set,local_50,0);
    if (iVar3 == -1) goto LAB_00123170;
    if (((ctx->models).search_paths != (char **)0x0) &&
       (pcVar15 = *(ctx->models).search_paths, pcVar15 != (char *)0x0)) {
      lVar18 = 8;
      do {
        local_50 = (lys_node *)strdup(pcVar15);
        if (local_50 == (lys_node *)0x0) goto LAB_00123148;
        iVar3 = ly_set_add(set,local_50,0);
        if (iVar3 == -1) goto LAB_00123170;
        pcVar15 = *(char **)((long)(ctx->models).search_paths + lVar18);
        lVar18 = lVar18 + 8;
      } while (pcVar15 != (char *)0x0);
    }
    if (set->number == 0) {
      local_50 = (lys_node *)0x0;
      __dirp = (DIR *)0x0;
      local_38 = (char *)0x0;
      format = LYS_IN_UNKNOWN;
    }
    else {
      lVar18 = sVar5 + 1;
      LVar17 = LYS_IN_UNKNOWN;
      local_38 = (char *)0x0;
      local_98 = 0;
      __dirp = (DIR *)0x0;
      local_50 = (lys_node *)0x0;
      do {
        free(local_50);
        free(local_48);
        local_48 = (char *)0x0;
        uVar4 = set->number - 1;
        set->number = uVar4;
        local_50 = (set->set).s[uVar4];
        wn = (char *)0x0;
        (set->set).s[uVar4] = (lys_node *)0x0;
        if ('\x01' < ly_log_level) {
          ly_log(LY_LLVRB,"Searching for \"%s\" in %s.",name);
        }
        if (__dirp != (DIR *)0x0) {
          closedir(__dirp);
        }
        __dirp = opendir((char *)local_50);
        sVar6 = strlen((char *)local_50);
        if (__dirp == (DIR *)0x0) {
          if ('\0' < ly_log_level) {
            piVar12 = __errno_location();
            strerror(*piVar12);
            ly_log(LY_LLWRN,"Unable to open directory \"%s\" for searching (sub)modules (%s).",
                   local_50);
          }
        }
        else {
          pdVar7 = readdir(__dirp);
          if (pdVar7 != (dirent *)0x0) {
            do {
              pcVar15 = pdVar7->d_name;
              iVar3 = strcmp(".",pcVar15);
              if ((iVar3 != 0) && (iVar3 = strcmp("..",pcVar15), iVar3 != 0)) {
                free(local_48);
                iVar3 = asprintf(&local_48,"%s/%s",local_50);
                if (iVar3 == -1) {
                  pLVar11 = ly_errno_location();
                  *pLVar11 = LY_EMEM;
                  wn = (char *)0x0;
                  ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyp_search_file");
                  pcVar15 = local_38;
                  goto LAB_0012317b;
                }
                iVar3 = stat(local_48,(stat *)local_138);
                if (iVar3 == -1) {
                  if ('\0' < ly_log_level) {
                    piVar12 = __errno_location();
                    pcVar9 = strerror(*piVar12);
                    ly_log(LY_LLWRN,
                           "Unable to get information about \"%s\" file in \"%s\" when searching for (sub)modules (%s)"
                           ,pcVar15,local_50,pcVar9);
                  }
                }
                else if (((uint)st.st_nlink & 0xf000) == 0x8000) {
                  iVar3 = strncmp(name,pcVar15,sVar5);
                  if ((iVar3 == 0) && ((cVar1 = pcVar15[sVar5], cVar1 == '@' || (cVar1 == '.')))) {
                    sVar8 = strlen(pcVar15);
                    iVar3 = strcmp(pcVar15 + (sVar8 - 4),".yin");
                    if (iVar3 == 0) {
                      format = LYS_IN_YIN;
                    }
                    else {
                      iVar3 = strcmp(pcVar15 + (sVar8 - 5),".yang");
                      if (iVar3 != 0) goto LAB_00122f95;
                      format = LYS_IN_YANG;
                    }
                    if (revision == (char *)0x0) {
                      if (local_38 == (char *)0x0) {
LAB_001230b0:
                        local_38 = local_48;
                        local_48 = (char *)0x0;
                        LVar17 = format;
                        local_98 = sVar6 + lVar18;
                      }
                      else if (cVar1 == '@') {
                        iVar3 = lyp_check_date(pcVar15 + lVar18);
                        if ((iVar3 == 0) &&
                           ((local_38[local_98] != '@' ||
                            (iVar3 = strncmp(local_38 + local_98 + 1,pcVar15 + lVar18,10), iVar3 < 0
                            )))) goto LAB_001230ab;
                      }
                    }
                    else {
                      if (cVar1 != '@') {
LAB_001230ab:
                        free(local_38);
                        goto LAB_001230b0;
                      }
                      sVar8 = strlen(revision);
                      iVar3 = strncmp(revision,pcVar15 + lVar18,sVar8);
                      if (iVar3 == 0) {
                        free(local_38);
                        pcVar15 = local_48;
                        local_48 = (char *)0x0;
                        goto LAB_0012323f;
                      }
                    }
                  }
                }
                else if ((((uint)st.st_nlink & 0xf000) == 0x4000) && (set->number != 0)) {
                  iVar3 = ly_set_add(set,local_48,0);
                  pcVar15 = local_38;
                  if (iVar3 == -1) goto LAB_0012317b;
                  local_48 = (char *)0x0;
                }
              }
LAB_00122f95:
              pdVar7 = readdir(__dirp);
            } while (pdVar7 != (dirent *)0x0);
          }
        }
        format = LVar17;
      } while (set->number != 0);
    }
    pcVar15 = local_38;
    if (local_38 != (char *)0x0) {
LAB_0012323f:
      if ('\x01' < ly_log_level) {
        ly_log(LY_LLVRB,"Loading schema from \"%s\" file.",pcVar15);
      }
      local_38 = pcVar15;
      pcVar9 = strrchr(pcVar15,0x2e);
      pcVar9[1] = '\0';
      if ((revision == (char *)0x0) && (lVar18 = (long)(ctx->models).used, 0 < lVar18)) {
        pplVar2 = (ctx->models).list;
        lVar16 = 0;
        do {
          plVar10 = pplVar2[lVar16];
          pcVar15 = plVar10->filepath;
          if ((pcVar15 != (char *)0x0) &&
             (iVar3 = strcmp(name,plVar10->name), pcVar20 = local_38, iVar3 == 0)) {
            wn = (char *)plVar10;
            sVar5 = strlen(local_38);
            pcVar13 = wn;
            iVar3 = strncmp(pcVar20,pcVar15,sVar5);
            pcVar15 = local_38;
            if (iVar3 == 0) {
              if ((implement == 0) || (pcVar13[0x40] < '\0')) {
                if ((pcVar13[0x40] & 0x40U) != 0) {
                  lys_set_enabled((lys_module *)pcVar13);
                }
              }
              else {
                iVar3 = lys_set_implemented((lys_module *)pcVar13);
                pcVar15 = local_38;
                wn = pcVar13;
                if (iVar3 != 0) {
                  wn = (char *)0x0;
                }
              }
              goto LAB_0012317b;
            }
          }
          lVar16 = lVar16 + 1;
        } while (lVar18 != lVar16);
      }
      pcVar15 = local_38;
      pcVar9[1] = 'y';
      iVar3 = open(local_38,0);
      if (iVar3 < 0) {
        pLVar11 = ly_errno_location();
        *pLVar11 = LY_ESYS;
        piVar12 = __errno_location();
        pcVar9 = strerror(*piVar12);
        wn = (char *)0x0;
        ly_log(LY_LLERR,"Unable to open data model file \"%s\" (%s).",pcVar15,pcVar9);
        goto LAB_0012317b;
      }
      if (module == (lys_module *)0x0) {
        plVar10 = lys_read_import(ctx,iVar3,format,revision,implement);
      }
      else {
        plVar10 = (lys_module *)
                  lys_sub_parse_fd(module,iVar3,format,(unres_schema *)st.__glibc_reserved[2]);
      }
      close(iVar3);
      if (plVar10 == (lys_module *)0x0) {
        wn = (char *)0x0;
        goto LAB_0012317b;
      }
      pcVar13 = strrchr(pcVar15,0x2f);
      pcVar20 = pcVar13 + 1;
      if (pcVar13 == (char *)0x0) {
        pcVar20 = pcVar15;
      }
      pcVar13 = strchr(pcVar20,0x40);
      pcVar15 = plVar10->name;
      wn = (char *)plVar10;
      sVar5 = strlen(pcVar15);
      iVar3 = strncmp(pcVar20,pcVar15,sVar5);
      if (iVar3 == 0) {
        pcVar14 = pcVar13;
        if (pcVar13 == (char *)0x0) {
          pcVar14 = pcVar9;
        }
        if (pcVar20 + sVar5 != pcVar14) goto LAB_00123467;
      }
      else {
LAB_00123467:
        if ('\0' < ly_log_level) {
          ly_log(LY_LLWRN,"File name \"%s\" does not match module name \"%s\".",pcVar20,pcVar15);
        }
      }
      pcVar15 = local_38;
      if (((pcVar13 != (char *)0x0) &&
          (((cVar1 = wn[0x41], cVar1 == '\0' || ((long)pcVar9 - (long)(pcVar13 + 1) != 10)) ||
           (iVar3 = strncmp(*(char **)(wn + 0x50),pcVar13 + 1,10), iVar3 != 0)))) &&
         ('\0' < ly_log_level)) {
        if (cVar1 == '\0') {
          pcVar9 = "none";
        }
        else {
          pcVar9 = *(char **)(wn + 0x50);
        }
        ly_log(LY_LLWRN,"File name \"%s\" does not match module revision \"%s\".",pcVar20,pcVar9);
      }
      pcVar15 = lydict_insert_zc(ctx,pcVar15);
      *(char **)(wn + 0x38) = pcVar15;
LAB_0012356b:
      pcVar15 = (char *)0x0;
      goto LAB_0012317b;
    }
    if (module == (lys_module *)0x0 && revision == (char *)0x0) {
      wn = (char *)ly_ctx_get_module(ctx,name,(char *)0x0);
    }
    else {
      wn = (char *)0x0;
    }
    if ((lys_module *)wn != (lys_module *)0x0) goto LAB_0012356b;
    pLVar11 = ly_errno_location();
    *pLVar11 = LY_ESYS;
    ly_log(LY_LLERR,"Data model \"%s\" not found.",name);
  }
  wn = (char *)0x0;
  pcVar15 = (char *)0x0;
LAB_0012317b:
  free(local_48);
  free(local_50);
  if (__dirp != (DIR *)0x0) {
    closedir(__dirp);
  }
  free(pcVar15);
  pcVar15 = wn;
  if (set->number != 0) {
    uVar19 = 0;
    do {
      free((set->set).s[uVar19]);
      uVar19 = uVar19 + 1;
    } while (uVar19 < set->number);
  }
  ly_set_free(set);
  return (lys_module *)pcVar15;
}

Assistant:

struct lys_module *
lyp_search_file(struct ly_ctx *ctx, struct lys_module *module, const char *name, const char *revision,
                int implement, struct unres_schema *unres)
{
    size_t len, flen, match_len = 0, dir_len;
    int fd, i;
    char *wd, *wn = NULL;
    DIR *dir = NULL;
    struct dirent *file;
    char *match_name = NULL, *dot, *rev, *filename;
    LYS_INFORMAT format, match_format = 0;
    struct lys_module *result = NULL;
    unsigned int u;
    struct ly_set *dirs;
    struct stat st;

    /* start to fill the dir fifo with the context's search path (if set)
     * and the current working directory */
    dirs = ly_set_new();
    if (!dirs) {
        LOGMEM;
        return NULL;
    }

    len = strlen(name);
    wd = get_current_dir_name();
    if (!wd) {
        LOGMEM;
        goto cleanup;
    } else if (ly_set_add(dirs, wd, 0) == -1) {
        goto cleanup;
    }
    if (ctx->models.search_paths) {
        for (i = 0; ctx->models.search_paths[i]; i++) {
            wd = strdup(ctx->models.search_paths[i]);
            if (!wd) {
                LOGMEM;
                goto cleanup;
            } else if (ly_set_add(dirs, wd, 0) == -1) {
                goto cleanup;
            }
        }
    }
    wd = NULL;

    /* start searching */
    while (dirs->number) {
        free(wd);
        free(wn); wn = NULL;

        dirs->number--;
        wd = (char *)dirs->set.g[dirs->number];
        dirs->set.g[dirs->number] = NULL;
        LOGVRB("Searching for \"%s\" in %s.", name, wd);

        if (dir) {
            closedir(dir);
        }
        dir = opendir(wd);
        dir_len = strlen(wd);
        if (!dir) {
            LOGWRN("Unable to open directory \"%s\" for searching (sub)modules (%s).", wd, strerror(errno));
        } else {
            while ((file = readdir(dir))) {
                if (!strcmp(".", file->d_name) || !strcmp("..", file->d_name)) {
                    /* skip . and .. */
                    continue;
                }
                free(wn);
                if (asprintf(&wn, "%s/%s", wd, file->d_name) == -1) {
                    LOGMEM;
                    goto cleanup;
                }
                if (stat(wn, &st) == -1) {
                    LOGWRN("Unable to get information about \"%s\" file in \"%s\" when searching for (sub)modules (%s)",
                           file->d_name, wd, strerror(errno));
                    continue;
                }
                if (S_ISDIR(st.st_mode) && dirs->number) {
                    /* we have another subdirectory in searchpath to explore,
                     * subdirectories are not taken into account in current working dir (dirs->set.g[0]) */
                    if (ly_set_add(dirs, wn, 0) == -1) {
                        goto cleanup;
                    }
                    /* continue with the next item in current directory */
                    wn = NULL;
                    continue;
                } else if (!S_ISREG(st.st_mode)) {
                    /* not a regular file (note that we see the target of symlinks instead of symlinks */
                    continue;
                }

                /* here we know that the item is a file which can contain a module */
                if (strncmp(name, file->d_name, len) ||
                        (file->d_name[len] != '.' && file->d_name[len] != '@')) {
                    /* different filename than the module we search for */
                    continue;
                }

                /* get type according to filename suffix */
                flen = strlen(file->d_name);
                if (!strcmp(&file->d_name[flen - 4], ".yin")) {
                    format = LYS_IN_YIN;
                } else if (!strcmp(&file->d_name[flen - 5], ".yang")) {
                    format = LYS_IN_YANG;
                } else {
                    /* not supportde suffix/file format */
                    continue;
                }

                if (revision) {
                    /* we look for the specific revision, try to get it from the filename */
                    if (file->d_name[len] == '@') {
                        /* check revision from the filename */
                        if (strncmp(revision, &file->d_name[len + 1], strlen(revision))) {
                            /* another revision */
                            continue;
                        } else {
                            /* exact revision */
                            free(match_name);
                            match_name = wn;
                            wn = NULL;
                            match_len = dir_len + 1 + len;
                            match_format = format;
                            goto matched;
                        }
                    } else {
                        /* continue trying to find exact revision match, use this only if not found */
                        free(match_name);
                        match_name = wn;
                        wn = NULL;
                        match_len = dir_len + 1 +len;
                        match_format = format;
                        continue;
                    }
                } else {
                    /* remember the revision and try to find the newest one */
                    if (match_name) {
                        if (file->d_name[len] != '@' || lyp_check_date(&file->d_name[len + 1])) {
                            continue;
                        } else if (match_name[match_len] == '@' &&
                                (strncmp(&match_name[match_len + 1], &file->d_name[len + 1], LY_REV_SIZE - 1) >= 0)) {
                            continue;
                        }
                        free(match_name);
                    }

                    match_name = wn;
                    wn = NULL;
                    match_len = dir_len + 1 + len;
                    match_format = format;
                    continue;
                }
            }
        }
    }

    if (!match_name) {
        if (!module && !revision) {
            /* otherwise the module would be already taken from the context */
            result = (struct lys_module *)ly_ctx_get_module(ctx, name, revision);
        }
        if (!result) {
            LOGERR(LY_ESYS, "Data model \"%s\" not found.", name);
        }
        goto cleanup;
    }

matched:
    LOGVRB("Loading schema from \"%s\" file.", match_name);

    /* cut the format for now */
    dot = strrchr(match_name, '.');
    dot[1] = '\0';

    /* check that the same file was not already loaded - it make sense only in case of loading the newest revision,
     * search also in disabled module - if the matching module is disabled, it will be enabled instead of loading it */
    if (!revision) {
        for (i = 0; i < ctx->models.used; ++i) {
            if (ctx->models.list[i]->filepath && !strcmp(name, ctx->models.list[i]->name)
                    && !strncmp(match_name, ctx->models.list[i]->filepath, strlen(match_name))) {
                result = ctx->models.list[i];
                if (implement && !result->implemented) {
                    /* make it implemented now */
                    if (lys_set_implemented(result)) {
                        result = NULL;
                    }
                } else if (result->disabled) {
                    lys_set_enabled(result);
                }

                goto cleanup;
            }
        }
    }

    /* add the format back */
    dot[1] = 'y';

    /* open the file */
    fd = open(match_name, O_RDONLY);
    if (fd < 0) {
        LOGERR(LY_ESYS, "Unable to open data model file \"%s\" (%s).",
               match_name, strerror(errno));
        goto cleanup;
    }

    if (module) {
        result = (struct lys_module *)lys_sub_parse_fd(module, fd, match_format, unres);
    } else {
        result = lys_read_import(ctx, fd, match_format, revision, implement);
    }
    close(fd);

    if (!result) {
        goto cleanup;
    }

    /* check that name and revision match filename */
    filename = strrchr(match_name, '/');
    if (!filename) {
        filename = match_name;
    } else {
        filename++;
    }
    rev = strchr(filename, '@');
    /* name */
    len = strlen(result->name);
    if (strncmp(filename, result->name, len) ||
            ((rev && rev != &filename[len]) || (!rev && dot != &filename[len]))) {
        LOGWRN("File name \"%s\" does not match module name \"%s\".", filename, result->name);
    }
    if (rev) {
        len = dot - ++rev;
        if (!result->rev_size || len != 10 || strncmp(result->rev[0].date, rev, len)) {
            LOGWRN("File name \"%s\" does not match module revision \"%s\".", filename,
                   result->rev_size ? result->rev[0].date : "none");
        }
    }

    result->filepath = lydict_insert_zc(ctx, match_name);
    match_name = NULL;
    /* success */

cleanup:
    free(wn);
    free(wd);
    if (dir) {
        closedir(dir);
    }
    free(match_name);
    for (u = 0; u < dirs->number; u++) {
        free(dirs->set.g[u]);
    }
    ly_set_free(dirs);

    return result;
}